

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O3

void PrintOutput(void *cvode_mem,sunrealtype t,N_Vector y)

{
  uint uVar1;
  undefined8 *puVar2;
  int qu;
  sunrealtype hu;
  long nst;
  uint local_2c;
  sunrealtype local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_28 = t;
  puVar2 = (undefined8 *)N_VGetArrayPointer(y);
  uVar1 = CVodeGetNumSteps(cvode_mem,&local_18);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumSteps",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetLastOrder(cvode_mem,&local_2c);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetLastOrder",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetLastStep(cvode_mem,&local_20);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetLastStep",
            (ulong)uVar1);
  }
  printf("%8.3e %2d  %8.3e %5ld\n",local_28,local_20,(ulong)local_2c,local_18);
  printf("                                Solution       ");
  printf("%12.4e %12.4e \n",*puVar2,puVar2[0x1c0]);
  printf("                                               ");
  printf("%12.4e %12.4e \n",puVar2[1],puVar2[0x1c1]);
  return;
}

Assistant:

static void PrintOutput(void* cvode_mem, sunrealtype t, N_Vector y)
{
  long int nst;
  int qu, retval;
  sunrealtype hu;
  sunrealtype* ydata;

  ydata = N_VGetArrayPointer(y);

  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetLastOrder(cvode_mem, &qu);
  check_retval(&retval, "CVodeGetLastOrder", 1);
  retval = CVodeGetLastStep(cvode_mem, &hu);
  check_retval(&retval, "CVodeGetLastStep", 1);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%8.3Le %2d  %8.3Le %5ld\n", t, qu, hu, nst);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%8.3e %2d  %8.3e %5ld\n", t, qu, hu, nst);
#else
  printf("%8.3e %2d  %8.3e %5ld\n", t, qu, hu, nst);
#endif

  printf("                                Solution       ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le \n", IJKth(ydata, 1, 0, 0),
         IJKth(ydata, 1, MX - 1, MZ - 1));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e \n", IJKth(ydata, 1, 0, 0),
         IJKth(ydata, 1, MX - 1, MZ - 1));
#else
  printf("%12.4e %12.4e \n", IJKth(ydata, 1, 0, 0),
         IJKth(ydata, 1, MX - 1, MZ - 1));
#endif
  printf("                                               ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le \n", IJKth(ydata, 2, 0, 0),
         IJKth(ydata, 2, MX - 1, MZ - 1));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e \n", IJKth(ydata, 2, 0, 0),
         IJKth(ydata, 2, MX - 1, MZ - 1));
#else
  printf("%12.4e %12.4e \n", IJKth(ydata, 2, 0, 0),
         IJKth(ydata, 2, MX - 1, MZ - 1));
#endif
}